

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> * __thiscall
kj::_::NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
          (NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this,
          NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *other)

{
  if (other != this) {
    if ((this->isSet == true) && (this->isSet = false, (this->field_1).value.tag - 1 < 2)) {
      (this->field_1).value.tag = 0;
    }
    if (other->isSet == true) {
      OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>::moveFrom
                (&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }